

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

Bits testing::internal::FloatingPoint<float>::SignAndMagnitudeToBiased(Bits *sam)

{
  Bits *sam_local;
  
  if ((*sam & 0x80000000) == 0) {
    sam_local._4_4_ = *sam | 0x80000000;
  }
  else {
    sam_local._4_4_ = (*sam ^ 0xffffffff) + 1;
  }
  return sam_local._4_4_;
}

Assistant:

static Bits SignAndMagnitudeToBiased(const Bits &sam) {
    if (kSignBitMask & sam) {
      // sam represents a negative number.
      return ~sam + 1;
    } else {
      // sam represents a positive number.
      return kSignBitMask | sam;
    }
  }